

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicFixedWingAircraft.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GED_BasicFixedWingAircraft *this)

{
  ostream *poVar1;
  ulong uVar2;
  ushort uVar3;
  char local_391;
  EntityType local_390;
  KString local_380;
  long *local_360;
  long local_358;
  long local_350 [2];
  KStringStream ss;
  ostream local_330 [112];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_330,"GED Basic Fixed Wing Aircraft\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_330,"\tEntity ID:                  ",0x1d);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_330);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tLocation Offsets(x,y,z):    ",0x1d);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_i16Offsets[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_i16Offsets[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_i16Offsets[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  EntityType::EntityType(&local_390,'\x01','\x02',0,'\0','\0','\0','\0');
  DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_(&local_380,&this->m_EA,&local_390);
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_391 = '\t';
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_391,1);
  if (local_380._M_string_length != 0) {
    uVar3 = 1;
    uVar2 = 0;
    do {
      local_391 = local_380._M_dataplus._M_p[uVar2];
      if ((local_380._M_string_length - 1 == uVar2) || (local_391 != '\n')) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_391,1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_391,1);
        local_391 = '\t';
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_391,1);
      }
      uVar2 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar2 < local_380._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_360,local_358);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tOrientation(Psi,Theta,Phi): ",0x1d);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(short)this->m_i8Ori[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(short)this->m_i8Ori[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(short)this->m_i8Ori[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tFuel Status:                ",0x1d);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tHorizontal Deviation:       ",0x1d);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(short)this->m_i8HoriDevi);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tVertical Deviation:         ",0x1d);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(short)this->m_i8VertDevi);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tSpeed:                      ",0x1d);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_i16Spd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if (local_360 != local_350) {
    operator_delete(local_360,local_350[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  DataTypeBase::~DataTypeBase(&local_390.super_DataTypeBase);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ios_base::~ios_base(local_2c0);
  return __return_storage_ptr__;
}

Assistant:

KString GED_BasicFixedWingAircraft::GetAsString() const
{
    KStringStream ss;

    ss << "GED Basic Fixed Wing Aircraft\n"
       << "\tEntity ID:                  " << m_ui16EntityID  << "\n"
       << "\tLocation Offsets(x,y,z):    " << m_i16Offsets[0] << " " << m_i16Offsets[1] << " " << m_i16Offsets[2] << "\n"
       << IndentString( m_EA.GetAsString( EntityType( Platform, Air, 0, 0, 0, 0, 0 ) ), 1 )
       << "\tOrientation(Psi,Theta,Phi): " << ( KINT16 )m_i8Ori[0]    << " " << ( KINT16 )m_i8Ori[1] << " " << ( KINT16 )m_i8Ori[2] << "\n"
       << "\tFuel Status:                " << ( KUINT16 )m_ui8FuelStatus << "\n"
       << "\tHorizontal Deviation:       " << ( KINT16 )m_i8HoriDevi  << "\n"
       << "\tVertical Deviation:         " << ( KINT16 )m_i8VertDevi  << "\n"
       << "\tSpeed:                      " << m_i16Spd << "\n";

    return ss.str();
}